

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O0

void __thiscall
duckdb::Serializer::WriteValue<std::pair<double,unsigned_long>>
          (Serializer *this,vector<std::pair<double,_unsigned_long>,_true> *vec)

{
  bool bVar1;
  vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
  *in_RSI;
  Serializer *in_RDI;
  pair<double,_unsigned_long> *item;
  const_iterator __end0;
  const_iterator __begin0;
  vector<std::pair<double,_unsigned_long>,_true> *__range2;
  size_type count;
  pair<double,_unsigned_long> *in_stack_ffffffffffffffb8;
  __normal_iterator<const_std::pair<double,_unsigned_long>_*,_std::vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>_>
  local_28;
  vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
  *local_20;
  size_type local_18;
  vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
  *local_10;
  
  local_10 = in_RSI;
  local_18 = ::std::
             vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
             ::size(in_RSI);
  (*(code *)((pair<double,_unsigned_long> *)in_RDI->_vptr_Serializer)[4].first)(in_RDI,local_18);
  local_20 = local_10;
  local_28._M_current =
       (pair<double,_unsigned_long> *)
       ::std::
       vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
       ::begin(in_stack_ffffffffffffffb8);
  ::std::
  vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>::end
            ((vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
              *)in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::pair<double,_unsigned_long>_*,_std::vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>_>
                        *)in_RDI,
                       (__normal_iterator<const_std::pair<double,_unsigned_long>_*,_std::vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>_>
                        *)in_stack_ffffffffffffffb8);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_std::pair<double,_unsigned_long>_*,_std::vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>_>
    ::operator*(&local_28);
    WriteValue<double,unsigned_long>(in_RDI,in_stack_ffffffffffffffb8);
    __gnu_cxx::
    __normal_iterator<const_std::pair<double,_unsigned_long>_*,_std::vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>_>
    ::operator++(&local_28);
  }
  (*(code *)((pair<double,_unsigned_long> *)in_RDI->_vptr_Serializer)[4].second)();
  return;
}

Assistant:

void WriteValue(const vector<T> &vec) {
		auto count = vec.size();
		OnListBegin(count);
		for (auto &item : vec) {
			WriteValue(item);
		}
		OnListEnd();
	}